

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenUnary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef value)

{
  Unary *pUVar1;
  Builder local_28;
  Expression *local_20;
  BinaryenExpressionRef value_local;
  BinaryenModuleRef pMStack_10;
  BinaryenOp op_local;
  BinaryenModuleRef module_local;
  
  local_20 = value;
  value_local._4_4_ = op;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_28,module);
  pUVar1 = wasm::Builder::makeUnary(&local_28,value_local._4_4_,local_20);
  return (BinaryenExpressionRef)pUVar1;
}

Assistant:

BinaryenExpressionRef BinaryenUnary(BinaryenModuleRef module,
                                    BinaryenOp op,
                                    BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeUnary(UnaryOp(op), (Expression*)value));
}